

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O0

void __thiscall
MaterialSystemTest_testMaterialNameAccess_Test::MaterialSystemTest_testMaterialNameAccess_Test
          (MaterialSystemTest_testMaterialNameAccess_Test *this)

{
  MaterialSystemTest_testMaterialNameAccess_Test *this_local;
  
  MaterialSystemTest::MaterialSystemTest(&this->super_MaterialSystemTest);
  (this->super_MaterialSystemTest).super_Test._vptr_Test =
       (_func_int **)&PTR__MaterialSystemTest_testMaterialNameAccess_Test_0103df80;
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testMaterialNameAccess) {
    aiMaterial *mat = new aiMaterial();
    EXPECT_NE(nullptr, mat);

    aiString name = mat->GetName();
    const int retValue(strncmp(name.C_Str(), AI_DEFAULT_MATERIAL_NAME, name.length));
    EXPECT_EQ(0, retValue );

    delete mat;
}